

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_device_buffer.cpp
# Opt level: O3

void __thiscall
gpu::shared_device_buffer::read2D
          (shared_device_buffer *this,size_t spitch,void *dst,size_t dpitch,size_t width,
          size_t height)

{
  Type TVar1;
  undefined1 local_e8 [16];
  size_t region [3];
  Context context;
  string local_a8;
  string local_88;
  size_t host_origin [3];
  size_t local_48 [3];
  
  if (dpitch == width && spitch == width) {
    read(this,(int)dst,(void *)(height * spitch),0);
    return;
  }
  Context::Context(&context);
  TVar1 = Context::type(&context);
  if (TVar1 == TypeOpenCL) {
    local_48[0] = this->offset_;
    local_48[1] = 0;
    local_48[2] = 0;
    host_origin[0] = 0;
    host_origin[1] = 0;
    host_origin[2] = 0;
    region[2] = 1;
    region[0] = width;
    region[1] = height;
    Context::cl((Context *)local_e8);
    ocl::OpenCLEngine::readBufferRect
              ((OpenCLEngine *)local_e8._0_8_,(cl_mem)this->data_,1,local_48,host_origin,region,
               spitch,0,dpitch,0,dst);
    if ((element_type *)local_e8._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
    }
  }
  else {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/PolarNick239[P]ExternalSortingOnGPU/libs/gpu/libgpu/shared_device_buffer.cpp"
               ,"");
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"No GPU context!","");
    raiseException(&local_88,0x158,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  if (context.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (context.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void shared_device_buffer::read2D(size_t spitch, void *dst, size_t dpitch, size_t width, size_t height) const
{
	if (spitch == width && dpitch == width) {
		read(dst, width * height);
		return;
	}

	Context context;
	switch (context.type()) {
#ifdef CUDA_SUPPORT
		case Context::TypeCUDA:
			CUDA_SAFE_CALL(cudaMemcpy2D(dst, dpitch, cuptr(), spitch, width, height, cudaMemcpyDeviceToHost));
			break;
#endif
		case Context::TypeOpenCL:
		{
			size_t buffer_origin[3] = { offset_, 0, 0 };
			size_t host_origin[3] = { 0, 0, 0 };
			size_t region[3] = { width, height, 1 };
			context.cl()->readBufferRect((cl_mem) data_, CL_TRUE, buffer_origin, host_origin, region, spitch, 0, dpitch, 0, dst);
		}
			break;
		default:
			gpu::raiseException(__FILE__, __LINE__, "No GPU context!");
	}
}